

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_highbd_quantize_sse4.c
# Opt level: O3

void av1_highbd_quantize_fp_sse4_1
               (tran_low_t *coeff_ptr,intptr_t count,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan,int log_scale)

{
  int *piVar1;
  int *piVar2;
  short *psVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  int iVar12;
  ulong uVar13;
  byte bVar14;
  short sVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  ulong uVar24;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar32 [16];
  uint uVar33;
  uint uVar35;
  undefined1 in_XMM3 [16];
  undefined1 auVar34 [16];
  int iVar41;
  undefined1 in_XMM4 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  ulong uVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  ulong uVar54;
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  ulong uVar65;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  ulong uVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  ulong uVar74;
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  ulong local_58;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  int iVar29;
  int iVar30;
  int iVar31;
  
  uVar18 = 0x10 - log_scale;
  memset(qcoeff_ptr,0,count * 4);
  memset(dqcoeff_ptr,0,count * 4);
  bVar14 = (byte)log_scale;
  iVar16 = (1 << (bVar14 & 0x1f)) >> 1;
  iVar12 = round_ptr[1] + iVar16 >> (bVar14 & 0x1f);
  auVar20 = *(undefined1 (*) [16])coeff_ptr;
  uVar33 = *(uint *)quant_ptr;
  uVar35 = *(uint *)dequant_ptr;
  auVar36 = pmovsxwd(in_XMM4,ZEXT416(uVar35));
  iVar41 = auVar36._4_4_;
  auVar34 = pabsd(in_XMM3,auVar20);
  auVar47._0_4_ = auVar20._0_4_ >> 0x1f;
  auVar47._4_4_ = auVar20._4_4_ >> 0x1f;
  auVar47._8_4_ = auVar20._8_4_ >> 0x1f;
  auVar47._12_4_ = auVar20._12_4_ >> 0x1f;
  auVar20._0_4_ = (*round_ptr + iVar16 >> (bVar14 & 0x1f)) + auVar34._0_4_;
  auVar20._4_4_ = iVar12 + auVar34._4_4_;
  auVar20._8_4_ = iVar12 + auVar34._8_4_;
  auVar20._12_4_ = iVar12 + auVar34._12_4_;
  auVar70._4_4_ = auVar20._8_4_;
  auVar70._0_4_ = auVar20._8_4_;
  auVar70._8_4_ = auVar20._12_4_;
  auVar70._12_4_ = auVar20._12_4_;
  auVar20 = pmovzxdq(auVar20,auVar20);
  auVar25 = pmovsxwq(ZEXT416(uVar33),ZEXT416(uVar33));
  auVar20 = pmuldq(auVar25,auVar20);
  uVar65 = (ulong)uVar18;
  auVar25._0_8_ = auVar20._0_8_ >> uVar65;
  auVar25._8_8_ = auVar20._8_8_ >> uVar65;
  auVar20 = pmovsxwq(in_XMM8,ZEXT416(uVar35));
  auVar20 = pmuldq(auVar20,auVar25);
  uVar13 = (ulong)(uint)log_scale;
  iVar16 = log_scale + 1;
  auVar55._0_4_ = -(uint)(auVar34._0_4_ << iVar16 < auVar36._0_4_);
  auVar55._4_4_ = -(uint)(auVar34._4_4_ < iVar41);
  auVar55._8_4_ = -(uint)(auVar34._8_4_ < iVar41);
  auVar55._12_4_ = -(uint)(auVar34._12_4_ < iVar41);
  sVar15 = (short)(uVar33 >> 0x10);
  auVar32._0_4_ = (uint)sVar15;
  auVar32._4_4_ = (uint)(sVar15 >> 0xf);
  auVar32._8_4_ = auVar32._0_4_;
  auVar32._12_4_ = auVar32._4_4_;
  auVar34 = pmuldq(auVar70,auVar32);
  auVar71._0_8_ = auVar34._0_8_ >> uVar65;
  auVar71._8_8_ = auVar34._8_8_ >> uVar65;
  sVar15 = (short)(uVar35 >> 0x10);
  uVar33 = (uint)sVar15;
  uVar35 = (uint)(sVar15 >> 0xf);
  auVar79._4_4_ = uVar35;
  auVar79._0_4_ = uVar33;
  auVar79._8_4_ = uVar33;
  auVar79._12_4_ = uVar35;
  auVar34._0_4_ = (undefined4)auVar25._0_8_;
  auVar34._4_4_ = (int)auVar25._8_8_;
  auVar34._8_4_ = (int)auVar71._0_8_;
  auVar34._12_4_ = (int)auVar71._8_8_;
  auVar25 = pmuldq(auVar71,auVar79);
  auVar66._0_4_ = (undefined4)(auVar20._0_8_ >> uVar13);
  auVar66._4_4_ = (int)(auVar20._8_8_ >> uVar13);
  auVar66._8_4_ = (int)(auVar25._0_8_ >> uVar13);
  auVar66._12_4_ = (int)(auVar25._8_8_ >> uVar13);
  auVar77 = pmovsxbd(in_XMM12,0x1010101);
  auVar25 = psignd(auVar34,auVar47 | auVar77);
  auVar20 = psignd(auVar66,auVar47 | auVar77);
  *(undefined1 (*) [16])qcoeff_ptr = ~auVar55 & auVar25;
  *(undefined1 (*) [16])dqcoeff_ptr = ~auVar55 & auVar20;
  auVar20 = *(undefined1 (*) [16])(coeff_ptr + 4);
  auVar25 = pabsd(~auVar55 & auVar25,auVar20);
  auVar36._0_4_ = auVar20._0_4_ >> 0x1f;
  auVar36._4_4_ = auVar20._4_4_ >> 0x1f;
  auVar36._8_4_ = auVar20._8_4_ >> 0x1f;
  auVar36._12_4_ = auVar20._12_4_ >> 0x1f;
  auVar48._0_4_ = auVar25._0_4_ + iVar12;
  auVar48._4_4_ = auVar25._4_4_ + iVar12;
  auVar48._8_4_ = auVar25._8_4_ + iVar12;
  auVar48._12_4_ = auVar25._12_4_ + iVar12;
  auVar56._4_4_ = auVar48._8_4_;
  auVar56._0_4_ = auVar48._8_4_;
  auVar56._8_4_ = auVar48._12_4_;
  auVar56._12_4_ = auVar48._12_4_;
  auVar20 = pmovzxdq(auVar48,auVar48);
  auVar20 = pmuldq(auVar20,auVar32);
  uVar65 = (ulong)uVar18;
  auVar49._0_8_ = auVar20._0_8_ >> uVar65;
  auVar49._8_8_ = auVar20._8_8_ >> uVar65;
  auVar34 = pmuldq(auVar49,auVar79);
  uVar13 = (ulong)(uint)log_scale;
  auVar72._0_4_ = -(uint)(auVar25._0_4_ << iVar16 < iVar41);
  auVar72._4_4_ = -(uint)(auVar25._4_4_ < iVar41);
  auVar72._8_4_ = -(uint)(auVar25._8_4_ < iVar41);
  auVar72._12_4_ = -(uint)(auVar25._12_4_ < iVar41);
  auVar20 = pmuldq(auVar56,auVar32);
  auVar57._0_8_ = auVar20._0_8_ >> uVar65;
  auVar57._8_8_ = auVar20._8_8_ >> uVar65;
  auVar50._0_4_ = (undefined4)auVar49._0_8_;
  auVar50._4_4_ = (int)auVar49._8_8_;
  auVar50._8_4_ = (int)auVar57._0_8_;
  auVar50._12_4_ = (int)auVar57._8_8_;
  auVar20 = pmuldq(auVar57,auVar79);
  uVar65 = auVar20._8_8_ >> uVar13;
  auVar67._0_4_ = (undefined4)(auVar34._0_8_ >> uVar13);
  auVar67._4_4_ = (int)(auVar34._8_8_ >> uVar13);
  auVar67._8_4_ = (int)(auVar20._0_8_ >> uVar13);
  auVar67._12_4_ = (int)uVar65;
  auVar51 = psignd(auVar50,auVar36 | auVar77);
  auVar68 = psignd(auVar67,auVar36 | auVar77);
  auVar68 = ~auVar72 & auVar68;
  *(undefined1 (*) [16])(qcoeff_ptr + 4) = ~auVar72 & auVar51;
  *(undefined1 (*) [16])(dqcoeff_ptr + 4) = auVar68;
  auVar42._0_4_ = -(uint)(*qcoeff_ptr == 0);
  auVar42._4_4_ = -(uint)(qcoeff_ptr[1] == 0);
  auVar42._8_4_ = -(uint)(qcoeff_ptr[2] == 0);
  auVar42._12_4_ = -(uint)(qcoeff_ptr[3] == 0);
  auVar77._0_4_ = -(uint)(qcoeff_ptr[4] == 0);
  auVar77._4_4_ = -(uint)(qcoeff_ptr[5] == 0);
  auVar77._8_4_ = -(uint)(qcoeff_ptr[6] == 0);
  auVar77._12_4_ = -(uint)(qcoeff_ptr[7] == 0);
  auVar20 = packssdw(auVar42,auVar77);
  auVar43._0_2_ = *iscan + auVar20._0_2_ + 1;
  auVar43._2_2_ = iscan[1] + auVar20._2_2_ + 1;
  auVar43._4_2_ = iscan[2] + auVar20._4_2_ + 1;
  auVar43._6_2_ = iscan[3] + auVar20._6_2_ + 1;
  auVar43._8_2_ = iscan[4] + auVar20._8_2_ + 1;
  auVar43._10_2_ = iscan[5] + auVar20._10_2_ + 1;
  auVar43._12_2_ = iscan[6] + auVar20._12_2_ + 1;
  auVar43._14_2_ = iscan[7] + auVar20._14_2_ + 1;
  auVar43 = ~auVar20 & auVar43;
  auVar44._2_2_ = (ushort)(-1 < auVar43._2_2_) * auVar43._2_2_;
  auVar44._0_2_ = (ushort)(-1 < auVar43._0_2_) * auVar43._0_2_;
  auVar44._4_2_ = (ushort)(-1 < auVar43._4_2_) * auVar43._4_2_;
  auVar44._6_2_ = (ushort)(-1 < auVar43._6_2_) * auVar43._6_2_;
  auVar44._8_2_ = (ushort)(-1 < auVar43._8_2_) * auVar43._8_2_;
  auVar44._10_2_ = (ushort)(-1 < auVar43._10_2_) * auVar43._10_2_;
  auVar44._12_2_ = (ushort)(-1 < auVar43._12_2_) * auVar43._12_2_;
  auVar44._14_2_ = (ushort)(-1 < auVar43._14_2_) * auVar43._14_2_;
  if (8 < count) {
    uVar17 = count + 8;
    uVar13 = (ulong)(uint)(0 >> (bVar14 & 0x1f));
    do {
      auVar20 = *(undefined1 (*) [16])((long)coeff_ptr + uVar13 * 2 + 0x20);
      auVar25 = *(undefined1 (*) [16])((long)coeff_ptr + uVar13 * 2 + 0x30);
      auVar34 = pabsd(auVar51,auVar20);
      auVar76._0_4_ = auVar20._0_4_ >> 0x1f;
      auVar76._4_4_ = auVar20._4_4_ >> 0x1f;
      auVar76._8_4_ = auVar20._8_4_ >> 0x1f;
      auVar76._12_4_ = auVar20._12_4_ >> 0x1f;
      auVar37._0_4_ = auVar34._0_4_ + iVar12;
      auVar37._4_4_ = auVar34._4_4_ + iVar12;
      auVar37._8_4_ = auVar34._8_4_ + iVar12;
      auVar37._12_4_ = auVar34._12_4_ + iVar12;
      auVar20 = pmovsxdq(auVar68,auVar37);
      uVar24 = auVar20._8_8_;
      uVar19 = (ulong)uVar18;
      uVar69 = (ulong)auVar20._0_4_ * (ulong)auVar32._0_4_ +
               ((auVar20._0_8_ >> 0x20) * (ulong)auVar32._0_4_ +
                (ulong)auVar20._0_4_ * (ulong)auVar32._4_4_ << 0x20) >> uVar19;
      uVar74 = (uVar24 & 0xffffffff) * (ulong)auVar32._0_4_ +
               ((uVar24 >> 0x20) * (ulong)auVar32._0_4_ +
                (uVar24 & 0xffffffff) * (ulong)auVar32._4_4_ << 0x20) >> uVar19;
      auVar78._0_4_ = -(uint)(auVar34._0_4_ << iVar16 < iVar41);
      auVar78._4_4_ = -(uint)(auVar34._4_4_ < iVar41);
      auVar78._8_4_ = -(uint)(auVar34._8_4_ < iVar41);
      auVar78._12_4_ = -(uint)(auVar34._12_4_ < iVar41);
      auVar4._4_8_ = uVar65;
      auVar4._0_4_ = auVar37._8_4_;
      auVar58._0_8_ = auVar4._0_8_ << 0x20;
      auVar58._8_4_ = auVar37._8_4_;
      auVar58._12_4_ = auVar37._12_4_;
      auVar5._4_8_ = auVar58._8_8_;
      auVar5._0_4_ = (int)auVar37._8_4_ >> 0x1f;
      auVar59._0_8_ = auVar5._0_8_ << 0x20;
      auVar59._8_4_ = (int)auVar37._8_4_ >> 0x1f;
      auVar59._12_4_ = auVar37._12_4_ >> 0x1f;
      auVar52._4_4_ = auVar37._8_4_;
      auVar52._0_4_ = auVar37._8_4_;
      auVar52._8_4_ = auVar37._12_4_;
      auVar52._12_4_ = auVar37._12_4_;
      uVar46 = (ulong)auVar37._8_4_ * (ulong)auVar32._0_4_ +
               ((auVar5._0_8_ & 0xffffffff) * (ulong)auVar32._0_4_ +
                (ulong)auVar37._8_4_ * (ulong)auVar32._4_4_ << 0x20) >> uVar19;
      uVar54 = (auVar52._8_8_ & 0xffffffff) * (ulong)auVar32._0_4_ +
               ((auVar59._8_8_ >> 0x20) * (ulong)auVar32._0_4_ +
                (auVar52._8_8_ & 0xffffffff) * (ulong)auVar32._4_4_ << 0x20) >> uVar19;
      auVar6._4_8_ = uVar74 << 0x20;
      auVar6._0_4_ = (int)uVar69 >> 0x1f;
      auVar45._0_8_ = auVar6._0_8_ << 0x20;
      auVar45._8_4_ = 0;
      auVar45._12_4_ = (int)uVar74 >> 0x1f;
      auVar7._4_8_ = uVar54 << 0x20;
      auVar7._0_4_ = (int)uVar46 >> 0x1f;
      auVar38._0_8_ = auVar7._0_8_ << 0x20;
      auVar38._8_4_ = 0;
      auVar38._12_4_ = (int)uVar54 >> 0x1f;
      auVar60._0_8_ = (uVar46 & 0xffffffff) * (ulong)uVar35;
      auVar60._8_8_ = (uVar54 & 0xffffffff) * (ulong)uVar35;
      auVar73._4_4_ = (int)uVar74;
      auVar73._0_4_ = (int)uVar69;
      auVar73._8_4_ = (int)uVar46;
      auVar73._12_4_ = (int)uVar54;
      auVar20 = pmovsxbd(ZEXT416(uVar18),0x1010101);
      auVar34 = psignd(auVar73,auVar76 | auVar20);
      *(undefined1 (*) [16])((long)qcoeff_ptr + uVar13 * 2 + 0x20) = ~auVar78 & auVar34;
      auVar36 = pabsd(auVar60,auVar25);
      auVar26._0_4_ = auVar36._0_4_ + iVar12;
      iVar29 = auVar36._4_4_;
      auVar26._4_4_ = iVar29 + iVar12;
      iVar30 = auVar36._8_4_;
      iVar31 = auVar36._12_4_;
      auVar26._8_4_ = iVar30 + iVar12;
      auVar26._12_4_ = iVar31 + iVar12;
      auVar34 = pmovsxdq(auVar20,auVar26);
      uVar24 = auVar34._8_8_;
      auVar68._0_8_ =
           (auVar34._0_8_ >> 0x20) * (ulong)auVar32._0_4_ +
           (ulong)auVar34._0_4_ * (ulong)auVar32._4_4_ << 0x20;
      auVar68._8_8_ =
           (uVar24 >> 0x20) * (ulong)auVar32._0_4_ + (uVar24 & 0xffffffff) * (ulong)auVar32._4_4_ <<
           0x20;
      uVar65 = (ulong)(uint)log_scale;
      local_58 = (ulong)uVar18;
      uVar19 = (ulong)auVar34._0_4_ * (ulong)auVar32._0_4_ + auVar68._0_8_ >> local_58;
      uVar24 = (uVar24 & 0xffffffff) * (ulong)auVar32._0_4_ + auVar68._8_8_ >> local_58;
      auVar80._0_4_ =
           (undefined4)
           ((uVar69 & 0xffffffff) * (ulong)uVar33 +
            (auVar6._0_8_ * (ulong)uVar33 + (uVar69 & 0xffffffff) * (ulong)uVar35 << 0x20) >> uVar65
           );
      auVar80._4_4_ =
           (int)((uVar74 & 0xffffffff) * (ulong)uVar33 +
                 ((auVar45._8_8_ >> 0x20) * (ulong)uVar33 + (uVar74 & 0xffffffff) * (ulong)uVar35 <<
                 0x20) >> uVar65);
      auVar80._8_4_ =
           (int)((uVar46 & 0xffffffff) * (ulong)uVar33 +
                 (auVar7._0_8_ * (ulong)uVar33 + auVar60._0_8_ << 0x20) >> uVar65);
      auVar80._12_4_ =
           (int)((uVar54 & 0xffffffff) * (ulong)uVar33 +
                 ((auVar38._8_8_ >> 0x20) * (ulong)uVar33 + auVar60._8_8_ << 0x20) >> uVar65);
      auVar8._4_8_ = uVar24 << 0x20;
      auVar8._0_4_ = (int)uVar19 >> 0x1f;
      auVar39._0_8_ = auVar8._0_8_ << 0x20;
      auVar39._8_4_ = 0;
      auVar39._12_4_ = (int)uVar24 >> 0x1f;
      auVar61._0_4_ = auVar36._0_4_ << iVar16;
      auVar61._4_4_ = iVar29;
      auVar61._8_4_ = iVar30;
      auVar61._12_4_ = iVar31;
      auVar40._0_4_ = -(uint)(auVar61._0_4_ < iVar41);
      auVar40._4_4_ = -(uint)(iVar29 < iVar41);
      auVar40._8_4_ = -(uint)(iVar30 < iVar41);
      auVar40._12_4_ = -(uint)(iVar31 < iVar41);
      auVar9._4_8_ = auVar61._8_8_;
      auVar9._0_4_ = auVar26._8_4_;
      auVar62._0_8_ = auVar9._0_8_ << 0x20;
      auVar62._8_4_ = auVar26._8_4_;
      auVar62._12_4_ = auVar26._12_4_;
      auVar10._4_8_ = auVar62._8_8_;
      auVar10._0_4_ = (int)auVar26._8_4_ >> 0x1f;
      auVar63._0_8_ = auVar10._0_8_ << 0x20;
      auVar63._8_4_ = (int)auVar26._8_4_ >> 0x1f;
      auVar63._12_4_ = (int)auVar26._12_4_ >> 0x1f;
      auVar27._4_4_ = auVar26._8_4_;
      auVar27._0_4_ = auVar26._8_4_;
      auVar27._8_4_ = auVar26._12_4_;
      auVar27._12_4_ = auVar26._12_4_;
      uVar46 = (ulong)auVar26._8_4_ * (ulong)auVar32._0_4_ +
               ((auVar10._0_8_ & 0xffffffff) * (ulong)auVar32._0_4_ +
                (ulong)auVar32._4_4_ * (ulong)auVar26._8_4_ << 0x20) >> local_58;
      uVar54 = (auVar27._8_8_ & 0xffffffff) * (ulong)auVar32._0_4_ +
               ((auVar63._8_8_ >> 0x20) * (ulong)auVar32._0_4_ +
                (auVar32._8_8_ >> 0x20) * (ulong)auVar26._12_4_ << 0x20) >> local_58;
      auVar34 = psignd(auVar80,auVar76 | auVar20);
      auVar11._4_8_ = uVar54 << 0x20;
      auVar11._0_4_ = (int)uVar46 >> 0x1f;
      auVar64._0_8_ = auVar11._0_8_ << 0x20;
      auVar64._8_4_ = 0;
      auVar64._12_4_ = (int)uVar54 >> 0x1f;
      uVar65 = (auVar64._8_8_ >> 0x20) * (ulong)uVar33 +
               (auVar79._8_8_ >> 0x20) * (uVar54 & 0xffffffff) << 0x20;
      auVar21._4_4_ = (int)uVar24;
      auVar21._0_4_ = (int)uVar19;
      auVar21._8_4_ = (int)uVar46;
      auVar21._12_4_ = (int)uVar54;
      uVar69 = (ulong)(uint)log_scale;
      local_48 = auVar44._0_2_;
      sStack_46 = auVar44._2_2_;
      sStack_44 = auVar44._4_2_;
      sStack_42 = auVar44._6_2_;
      sStack_40 = auVar44._8_2_;
      sStack_3e = auVar44._10_2_;
      sStack_3c = auVar44._12_2_;
      sStack_3a = auVar44._14_2_;
      auVar53._0_4_ =
           (undefined4)
           ((uVar19 & 0xffffffff) * (ulong)uVar33 +
            (auVar8._0_8_ * (ulong)uVar33 + (uVar19 & 0xffffffff) * (ulong)uVar35 << 0x20) >> uVar69
           );
      auVar53._4_4_ =
           (int)((uVar24 & 0xffffffff) * (ulong)uVar33 +
                 ((auVar39._8_8_ >> 0x20) * (ulong)uVar33 + (uVar24 & 0xffffffff) * (ulong)uVar35 <<
                 0x20) >> uVar69);
      auVar53._8_4_ =
           (int)((uVar46 & 0xffffffff) * (ulong)uVar33 +
                 (auVar11._0_8_ * (ulong)uVar33 + (ulong)uVar35 * (uVar46 & 0xffffffff) << 0x20) >>
                uVar69);
      auVar53._12_4_ = (int)((uVar54 & 0xffffffff) * (ulong)uVar33 + uVar65 >> uVar69);
      auVar75._0_4_ = auVar25._0_4_ >> 0x1f;
      auVar75._4_4_ = auVar25._4_4_ >> 0x1f;
      auVar75._8_4_ = auVar25._8_4_ >> 0x1f;
      auVar75._12_4_ = auVar25._12_4_ >> 0x1f;
      auVar20 = psignd(auVar21,auVar75 | _DAT_004cdec0);
      auVar25 = psignd(auVar53,auVar75 | _DAT_004cdec0);
      *(undefined1 (*) [16])((long)dqcoeff_ptr + uVar13 * 2 + 0x20) = ~auVar78 & auVar34;
      auVar51._8_4_ = 0xffffffff;
      auVar51._0_8_ = 0xffffffffffffffff;
      auVar51._12_4_ = 0xffffffff;
      *(undefined1 (*) [16])((long)qcoeff_ptr + uVar13 * 2 + 0x30) = ~auVar40 & auVar20;
      *(undefined1 (*) [16])((long)dqcoeff_ptr + uVar13 * 2 + 0x30) = ~auVar40 & auVar25;
      piVar1 = (int *)((long)qcoeff_ptr + uVar13 * 2 + 0x20);
      piVar2 = (int *)((long)qcoeff_ptr + uVar13 * 2 + 0x30);
      auVar22._0_4_ = -(uint)(*piVar1 == 0);
      auVar22._4_4_ = -(uint)(piVar1[1] == 0);
      auVar22._8_4_ = -(uint)(piVar1[2] == 0);
      auVar22._12_4_ = -(uint)(piVar1[3] == 0);
      auVar28._0_4_ = -(uint)(*piVar2 == 0);
      auVar28._4_4_ = -(uint)(piVar2[1] == 0);
      auVar28._8_4_ = -(uint)(piVar2[2] == 0);
      auVar28._12_4_ = -(uint)(piVar2[3] == 0);
      auVar20 = packssdw(auVar22,auVar28);
      psVar3 = (short *)((long)iscan + uVar13 + 0x10);
      auVar23._0_2_ = *psVar3 + auVar20._0_2_ + 1;
      auVar23._2_2_ = psVar3[1] + auVar20._2_2_ + 1;
      auVar23._4_2_ = psVar3[2] + auVar20._4_2_ + 1;
      auVar23._6_2_ = psVar3[3] + auVar20._6_2_ + 1;
      auVar23._8_2_ = psVar3[4] + auVar20._8_2_ + 1;
      auVar23._10_2_ = psVar3[5] + auVar20._10_2_ + 1;
      auVar23._12_2_ = psVar3[6] + auVar20._12_2_ + 1;
      auVar23._14_2_ = psVar3[7] + auVar20._14_2_ + 1;
      auVar23 = ~auVar20 & auVar23;
      sVar15 = auVar23._0_2_;
      auVar44._0_2_ = (ushort)(local_48 < sVar15) * sVar15 | (ushort)(local_48 >= sVar15) * local_48
      ;
      sVar15 = auVar23._2_2_;
      auVar44._2_2_ =
           (ushort)(sStack_46 < sVar15) * sVar15 | (ushort)(sStack_46 >= sVar15) * sStack_46;
      sVar15 = auVar23._4_2_;
      auVar44._4_2_ =
           (ushort)(sStack_44 < sVar15) * sVar15 | (ushort)(sStack_44 >= sVar15) * sStack_44;
      sVar15 = auVar23._6_2_;
      auVar44._6_2_ =
           (ushort)(sStack_42 < sVar15) * sVar15 | (ushort)(sStack_42 >= sVar15) * sStack_42;
      sVar15 = auVar23._8_2_;
      auVar44._8_2_ =
           (ushort)(sStack_40 < sVar15) * sVar15 | (ushort)(sStack_40 >= sVar15) * sStack_40;
      sVar15 = auVar23._10_2_;
      auVar44._10_2_ =
           (ushort)(sStack_3e < sVar15) * sVar15 | (ushort)(sStack_3e >= sVar15) * sStack_3e;
      sVar15 = auVar23._12_2_;
      auVar44._12_2_ =
           (ushort)(sStack_3c < sVar15) * sVar15 | (ushort)(sStack_3c >= sVar15) * sStack_3c;
      sVar15 = auVar23._14_2_;
      auVar44._14_2_ =
           (ushort)(sStack_3a < sVar15) * sVar15 | (ushort)(sStack_3a >= sVar15) * sStack_3a;
      uVar17 = uVar17 - 8;
      uVar13 = uVar13 + 0x10;
    } while (0x10 < uVar17);
  }
  auVar20 = phminposuw(auVar44 ^ _DAT_00515160);
  *eob_ptr = auVar20._0_2_ ^ 0x7fff;
  return;
}

Assistant:

void av1_highbd_quantize_fp_sse4_1(
    const tran_low_t *coeff_ptr, intptr_t count, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan, int log_scale) {
  __m128i coeff[2], qcoeff[3], dequant[2], qparam[4], coeff_sign;
  __m128i eob = _mm_setzero_si128();
  const tran_low_t *src = coeff_ptr;
  tran_low_t *quanAddr = qcoeff_ptr;
  tran_low_t *dquanAddr = dqcoeff_ptr;
  const int shift = 16 - log_scale;
  const int coeff_stride = 4;
  const int quan_stride = coeff_stride;
  (void)zbin_ptr;
  (void)quant_shift_ptr;
  (void)scan;

  memset(quanAddr, 0, count * sizeof(quanAddr[0]));
  memset(dquanAddr, 0, count * sizeof(dquanAddr[0]));

  coeff[0] = _mm_loadu_si128((__m128i const *)src);
  const int round1 = ROUND_POWER_OF_TWO(round_ptr[1], log_scale);
  const int round0 = ROUND_POWER_OF_TWO(round_ptr[0], log_scale);

  qparam[0] = _mm_set_epi32(round1, round1, round1, round0);
  qparam[1] = _mm_set_epi64x((uint32_t)quant_ptr[1], (uint32_t)quant_ptr[0]);
  qparam[2] =
      _mm_set_epi64x((uint32_t)dequant_ptr[1], (uint32_t)dequant_ptr[0]);
  qparam[3] = _mm_set_epi32(dequant_ptr[1], dequant_ptr[1], dequant_ptr[1],
                            dequant_ptr[0]);

  // DC and first 3 AC
  quantize_coeff_phase1(&coeff[0], qparam, shift, log_scale, qcoeff, dequant,
                        &coeff_sign);

  // update round/quan/dquan for AC
  qparam[0] = _mm_unpackhi_epi64(qparam[0], qparam[0]);
  qparam[1] = _mm_set1_epi64x((uint32_t)quant_ptr[1]);
  qparam[2] = _mm_set1_epi64x((uint32_t)dequant_ptr[1]);
  qparam[3] = _mm_set1_epi32(dequant_ptr[1]);
  quantize_coeff_phase2(qcoeff, dequant, &coeff_sign, qparam, shift, log_scale,
                        quanAddr, dquanAddr);

  // next 4 AC
  coeff[1] = _mm_loadu_si128((__m128i const *)(src + coeff_stride));
  quantize_coeff_phase1(&coeff[1], qparam, shift, log_scale, qcoeff, dequant,
                        &coeff_sign);
  quantize_coeff_phase2(qcoeff, dequant, &coeff_sign, qparam, shift, log_scale,
                        quanAddr + quan_stride, dquanAddr + quan_stride);

  find_eob(quanAddr, iscan, &eob);

  count -= 8;

  // loop for the rest of AC
  while (count > 0) {
    src += coeff_stride << 1;
    quanAddr += quan_stride << 1;
    dquanAddr += quan_stride << 1;
    iscan += quan_stride << 1;

    coeff[0] = _mm_loadu_si128((__m128i const *)src);
    coeff[1] = _mm_loadu_si128((__m128i const *)(src + coeff_stride));

    quantize_coeff_phase1(&coeff[0], qparam, shift, log_scale, qcoeff, dequant,
                          &coeff_sign);
    quantize_coeff_phase2(qcoeff, dequant, &coeff_sign, qparam, shift,
                          log_scale, quanAddr, dquanAddr);

    quantize_coeff_phase1(&coeff[1], qparam, shift, log_scale, qcoeff, dequant,
                          &coeff_sign);
    quantize_coeff_phase2(qcoeff, dequant, &coeff_sign, qparam, shift,
                          log_scale, quanAddr + quan_stride,
                          dquanAddr + quan_stride);

    find_eob(quanAddr, iscan, &eob);

    count -= 8;
  }
  *eob_ptr = get_accumulated_eob(&eob);
}